

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_device_memory_device.cpp
# Opt level: O3

void device_cleanup(void)

{
  rtcReleaseScene(embree::data);
  embree::data = 0;
  embree::alignedUSMFree(DAT_002cad48);
  DAT_002cad48 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cad50);
  DAT_002cad50 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cad58);
  DAT_002cad58 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cad70);
  DAT_002cad70 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cad60);
  DAT_002cad60 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cad68);
  DAT_002cad68 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cad78);
  DAT_002cad78 = (void *)0x0;
  return;
}

Assistant:

void device_cleanup ()
{
  TutorialData_Destructor(&data);
}